

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void send_negotiation(Curl_easy *data,int cmd,int option)

{
  ssize_t sVar1;
  uint *puVar2;
  uchar buf [3];
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  local_1a = (undefined1)cmd;
  local_1b = 0xff;
  local_19 = (undefined1)option;
  sVar1 = send(data->conn->sock[0],&local_1b,3,0x4000);
  if (sVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar2);
  }
  printoption(data,"SENT",cmd,option);
  return;
}

Assistant:

static void send_negotiation(struct Curl_easy *data, int cmd, int option)
{
  unsigned char buf[3];
  ssize_t bytes_written;
  struct connectdata *conn = data->conn;

  buf[0] = CURL_IAC;
  buf[1] = (unsigned char)cmd;
  buf[2] = (unsigned char)option;

  bytes_written = swrite(conn->sock[FIRSTSOCKET], buf, 3);
  if(bytes_written < 0) {
    int err = SOCKERRNO;
    failf(data,"Sending data failed (%d)",err);
  }

  printoption(data, "SENT", cmd, option);
}